

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<kratos::FSM,_std::shared_ptr<kratos::FSM>_> * __thiscall
pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
def<void(kratos::FSM::*)(std::shared_ptr<kratos::FSMState>const&)>
          (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *this,char *name_,
          offset_in_Var_to_subr *f)

{
  offset_in_Var_to_subr f_00;
  name *extra;
  is_method local_50;
  sibling local_48;
  object local_40;
  cpp_function local_38;
  cpp_function cf;
  
  f_00 = *f;
  extra = (name *)f[1];
  local_48.value.m_ptr = *(handle *)this;
  local_40.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_50.class_.m_ptr = (handle)(handle)name_;
  getattr((pybind11 *)&cf,local_48.value,name_,(PyObject *)&_Py_NoneStruct);
  cpp_function::
  cpp_function<void,kratos::FSM,std::shared_ptr<kratos::FSMState>const&,pybind11::name,pybind11::is_method,pybind11::sibling>
            (&local_38,f_00,extra,&local_50,&local_48);
  object::~object((object *)&cf);
  object::~object(&local_40);
  pybind11::detail::add_class_method((object *)this,name_,&local_38);
  object::~object((object *)&local_38);
  return (class_<kratos::FSM,_std::shared_ptr<kratos::FSM>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }